

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-walk.c
# Opt level: O2

ztresult_t
zt_walk(ztstruct_t *metastruct,void *structure,ztregion_t *regions,int nregions,
       ztwalkhandlers_t *walkhandlers,void *opaque)

{
  ztarray *pzVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  ztresult_t zVar5;
  ztfield_t *pzVar6;
  ulong uVar7;
  ulong uVar8;
  ztindex_t zVar9;
  size_t sVar10;
  ztregion_t *pzVar11;
  ulong uVar12;
  ztfield_t *pzVar13;
  char *pcVar14;
  ztstruct *metastruct_00;
  long lVar15;
  ztuchar_t *pvalue;
  ulong *structure_00;
  
  pzVar6 = metastruct->fields;
  uVar12 = 0;
  pzVar13 = pzVar6;
  if (0 < nregions) {
    uVar12 = (ulong)(uint)nregions;
  }
  do {
    if (pzVar6 + metastruct->nfields <= pzVar13) {
      return 0;
    }
    iVar4 = pzVar13->stride;
    if (iVar4 == 0) {
      iVar4 = pzVar13->nelems;
    }
    if (zttype_custom < pzVar13->type) {
      return 0x60;
    }
    structure_00 = (ulong *)(pzVar13->offset + (long)structure);
    sVar10 = (size_t)iVar4;
    switch(pzVar13->type) {
    case zttype_uchar:
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
      goto LAB_001027bb;
    case zttype_ucharptr:
      structure_00 = (ulong *)*structure_00;
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
LAB_001027bb:
      iVar4 = (*walkhandlers->uchar)(pcVar14,(ztuchar_t *)structure_00,(long)iVar4,sVar10,opaque);
      break;
    case zttype_ushort:
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
      goto LAB_0010277c;
    case zttype_ushortptr:
      structure_00 = (ulong *)*structure_00;
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
LAB_0010277c:
      iVar4 = (*walkhandlers->ushort)(pcVar14,(ztushort_t *)structure_00,(long)iVar4,sVar10,opaque);
      break;
    case zttype_uint:
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
      goto LAB_001027d1;
    case zttype_uintptr:
      structure_00 = (ulong *)*structure_00;
      pcVar14 = pzVar13->name;
      iVar4 = pzVar13->nelems;
LAB_001027d1:
      iVar4 = (*walkhandlers->uint)(pcVar14,(ztuint_t *)structure_00,(long)iVar4,sVar10,opaque);
      break;
    case zttype_struct:
      if (pzVar13->nelems != 1) {
        zVar5 = (*walkhandlers->startarray)(pzVar13->name,pzVar13->nelems,opaque);
        if (zVar5 != 0) {
          return zVar5;
        }
        lVar15 = 0;
        while (lVar15 < pzVar13->nelems) {
          zVar5 = (*walkhandlers->startstruct)((char *)0x0,opaque);
          if (zVar5 != 0) {
            return zVar5;
          }
          zVar5 = zt_walk(pzVar13->metadata,(ulong *)(pzVar13->size * lVar15 + (long)structure_00),
                          regions,nregions,walkhandlers,opaque);
          if (zVar5 != 0) {
            return zVar5;
          }
          zVar5 = (*walkhandlers->endstruct)(opaque);
          lVar15 = lVar15 + 1;
          if (zVar5 != 0) {
            return zVar5;
          }
        }
        goto LAB_001029e6;
      }
      zVar5 = (*walkhandlers->startstruct)(pzVar13->name,opaque);
      if (zVar5 != 0) {
        return zVar5;
      }
      metastruct_00 = pzVar13->metadata;
LAB_00102803:
      zVar5 = zt_walk(metastruct_00,structure_00,regions,nregions,walkhandlers,opaque);
      if (zVar5 != 0) {
        return zVar5;
      }
      iVar4 = (*walkhandlers->endstruct)(opaque);
      break;
    case zttype_structptr:
      if (pzVar13->nelems == 1) {
        zVar5 = (*walkhandlers->startstruct)(pzVar13->name,opaque);
        if (zVar5 != 0) {
          return zVar5;
        }
        metastruct_00 = pzVar13->metadata;
        structure_00 = (ulong *)*structure_00;
        goto LAB_00102803;
      }
      zVar5 = (*walkhandlers->startarray)(pzVar13->name,pzVar13->nelems,opaque);
      if (zVar5 != 0) {
        return zVar5;
      }
      lVar15 = 0;
      while ((int)lVar15 < pzVar13->nelems) {
        zVar5 = (*walkhandlers->startstruct)((char *)0x0,opaque);
        if (zVar5 != 0) {
          return zVar5;
        }
        zVar5 = zt_walk(pzVar13->metadata,(void *)structure_00[lVar15],regions,nregions,walkhandlers
                        ,opaque);
        if (zVar5 != 0) {
          return zVar5;
        }
        zVar5 = (*walkhandlers->endstruct)(opaque);
        lVar15 = lVar15 + 1;
        if (zVar5 != 0) {
          return zVar5;
        }
      }
LAB_001029e6:
      zVar5 = (*walkhandlers->endarray)(opaque);
      if (zVar5 != 0) {
        return zVar5;
      }
      goto LAB_001029d4;
    case zttype_staticarrayidx:
      if (pzVar13->nelems != 1) {
        return 0x90;
      }
      pvVar2 = (void *)*structure_00;
      zVar9 = 0xffffffffffffffff;
      if (pvVar2 != (void *)0x0) {
        pzVar1 = pzVar13->array;
        pvVar3 = pzVar1->base;
        uVar7 = (long)pvVar2 - (long)pvVar3;
        if (pvVar2 < pvVar3) {
          return 0x80;
        }
        sVar10 = pzVar1->length;
        if ((void *)((long)pvVar3 + sVar10) <= pvVar2) {
          return 0x80;
        }
        iVar4 = pzVar1->nelems;
LAB_001029af:
        zVar9 = uVar7 / (sVar10 / (ulong)(long)iVar4);
      }
      goto LAB_001029c5;
    case zttype_arrayidx:
      if (pzVar13->nelems != 1) {
        return 0x90;
      }
      uVar7 = 0;
      for (pzVar11 = regions;
          (uVar8 = uVar12, uVar12 != uVar7 && (uVar8 = uVar7, pzVar11->id != pzVar13->regionid));
          pzVar11 = pzVar11 + 1) {
        uVar7 = uVar7 + 1;
      }
      if ((int)uVar8 == nregions) {
        return 0x20;
      }
      pvVar2 = (void *)*structure_00;
      zVar9 = 0xffffffffffffffff;
      if (pvVar2 != (void *)0x0) {
        uVar8 = uVar8 & 0xffffffff;
        pvVar3 = regions[uVar8].spec.base;
        uVar7 = (long)pvVar2 - (long)pvVar3;
        if (pvVar2 < pvVar3) {
          return 0x80;
        }
        sVar10 = regions[uVar8].spec.length;
        if ((void *)((long)pvVar3 + sVar10) <= pvVar2) {
          return 0x80;
        }
        iVar4 = regions[uVar8].spec.nelems;
        goto LAB_001029af;
      }
LAB_001029c5:
      iVar4 = (*walkhandlers->index)(pzVar13->name,zVar9,opaque);
      break;
    case zttype_version:
      iVar4 = (*walkhandlers->version)(pzVar13->name,(ztversion_t)*structure_00,opaque);
      break;
    case zttype_custom:
      iVar4 = (*walkhandlers->custom)(pzVar13->name,pzVar13->typeidx,structure_00,opaque);
    }
    if (iVar4 != 0) {
      return iVar4;
    }
LAB_001029d4:
    pzVar6 = metastruct->fields;
    pzVar13 = pzVar13 + 1;
  } while( true );
}

Assistant:

ztresult_t zt_walk(const ztstruct_t       *metastruct,
                   const void             *structure,
                   const ztregion_t       *regions,
                   int                     nregions,
                   const ztwalkhandlers_t *walkhandlers,
                   void                   *opaque)
{
  int              rc;
  const ztfield_t *f;

  for (f = &metastruct->fields[0]; f < &metastruct->fields[metastruct->nfields]; f++)
  {
    const void *rawvalue = (const char *) structure + f->offset;
    int         stride   = (f->stride == ZT_NO_STRIDE) ? f->nelems : f->stride;

    switch (f->type)
    {
    case zttype_uchar:
      {
        const ztuchar_t *pvalue = rawvalue;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ucharptr:
      {
        const ztuchar_t **ppdata = (const ztuchar_t **) rawvalue;
        const ztuchar_t  *pvalue = *ppdata;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushort:
      {
        const ztushort_t *pvalue = rawvalue;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushortptr:
      {
        const ztushort_t **ppdata = (const ztushort_t **) rawvalue;
        const ztushort_t  *pvalue = *ppdata;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uint:
      {
        const ztuint_t *pvalue = rawvalue;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uintptr:
      {
        const ztuint_t **ppdata = (const ztuint_t **) rawvalue;
        const ztuint_t  *pvalue = *ppdata;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_struct:
      {
        const void *pstruct = rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       pstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int i;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (i = 0; i < f->nelems; i++)
          {
            rc = walkhandlers->startstruct(NULL /* name */, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         (char *) pstruct + i * f->size,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_structptr:
      {
        const unsigned char **ppstruct = (const unsigned char **) rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       *ppstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int j;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (j = 0; j < f->nelems; j++)
          {
            rc = walkhandlers->startstruct(NULL, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         *ppstruct++,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_staticarrayidx:
      {
        const ztarray_t *array;
        const char      *base;
        const char      *end;
        const char      *pp;
        const char      *ptr;
        unsigned long    index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        array = f->array;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const char *) structure + f->offset;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_arrayidx:
      {
        int                   r;
        const ztarray_t      *array;
        const char           *base;
        const char           *end;
        const unsigned char **pp;
        const char           *ptr;
        unsigned long         index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        /* find f->regionid in regions[] */
        for (r = 0; r < nregions; r++)
          if (regions[r].id == f->regionid)
            break;

        if (r == nregions)
          return ztresult_UNKNOWN_REGION;

        /* use the array spec to turn it into an index */
        array = &regions[r].spec;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const unsigned char **) rawvalue;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_version:
      {
        const ztversion_t *pvalue = rawvalue;
        rc = walkhandlers->version(f->name, *pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_custom:
      {
        const void *pvalue = rawvalue;
        rc = walkhandlers->custom(f->name, f->typeidx, pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    default:
      return ztresult_UNKNOWN_TYPE;
    }
  }

  return ztresult_OK;
}